

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O2

int tool_readbusy_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  long lVar1;
  int iVar2;
  long lVar3;
  timediff_t tVar4;
  ulong uVar5;
  curltime cVar6;
  curltime newer;
  curltime older;
  
  lVar1 = *(long *)((long)clientp + 0x10);
  uVar5 = *(ulong *)(lVar1 + 0x4e4);
  if (((uint)uVar5 >> 0x1d & 1) != 0) {
    if (tool_readbusy_cb::ulprev == ulnow) {
      cVar6 = curlx_now();
      dlnow = cVar6._8_8_;
      if (tool_readbusy_cb_prev_0 != 0) {
        lVar3 = tool_readbusy_cb::rate / -4;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar6._0_12_,0);
        newer.tv_usec = SUB124(cVar6._0_12_,8);
        older.tv_usec = tool_readbusy_cb_prev_1;
        older.tv_sec = tool_readbusy_cb_prev_0;
        older._12_4_ = 0;
        tVar4 = curlx_timediff(newer,older);
        dlnow = tVar4 % 4;
        tool_readbusy_cb::rate = tVar4 / 4 + lVar3 + tool_readbusy_cb::rate;
      }
      tool_readbusy_cb_prev_0 = cVar6.tv_sec;
      tool_readbusy_cb_prev_1 = cVar6.tv_usec;
      if (tool_readbusy_cb::rate < 0x32) {
        tool_go_sleep(0x19);
        goto LAB_0010c0ed;
      }
      uVar5 = *(ulong *)(lVar1 + 0x4e4);
    }
    else {
      tool_readbusy_cb::rate = 0x32;
      tool_readbusy_cb::ulprev = ulnow;
    }
    *(ulong *)(lVar1 + 0x4e4) = uVar5 & 0xffffffffdfffffff;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0,dlnow);
  }
LAB_0010c0ed:
  iVar2 = 0x10000001;
  if ((*(byte *)((long)clientp + 0x1d8) & 2) != 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int tool_readbusy_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;

  (void)dltotal;  /* unused */
  (void)dlnow;  /* unused */
  (void)ultotal;  /* unused */
  (void)ulnow;  /* unused */

  if(config->readbusy) {
    /* lame code to keep the rate down because the input might not deliver
       anything, get paused again and come back here immediately */
    static timediff_t rate = 500;
    static struct curltime prev;
    static curl_off_t ulprev;

    if(ulprev == ulnow) {
      /* it did not upload anything since last call */
      struct curltime now = curlx_now();
      if(prev.tv_sec)
        /* get a rolling average rate */
        rate -= rate/4 - curlx_timediff(now, prev)/4;
      prev = now;
    }
    else {
      rate = 50;
      ulprev = ulnow;
    }
    if(rate >= 50) {
      /* keeps the looping down to 20 times per second in the crazy case */
      config->readbusy = FALSE;
      curl_easy_pause(per->curl, CURLPAUSE_CONT);
    }
    else
      /* sleep half a period */
      tool_go_sleep(25);
  }

  return per->noprogress ? 0 : CURL_PROGRESSFUNC_CONTINUE;
}